

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmx-impl.inc.c
# Opt level: O0

void gen_vmladduhm(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_ptr arg2;
  TCGv_ptr arg3;
  TCGv_ptr arg4;
  TCGv_ptr arg1;
  TCGv_ptr rd;
  TCGv_ptr rc;
  TCGv_ptr rb;
  TCGv_ptr ra;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->altivec_enabled ^ 0xffU) & 1) == 0) {
    uVar1 = rA(ctx->opcode);
    arg2 = gen_avr_ptr(tcg_ctx_00,uVar1);
    uVar1 = rB(ctx->opcode);
    arg3 = gen_avr_ptr(tcg_ctx_00,uVar1);
    uVar1 = rC(ctx->opcode);
    arg4 = gen_avr_ptr(tcg_ctx_00,uVar1);
    uVar1 = rD(ctx->opcode);
    arg1 = gen_avr_ptr(tcg_ctx_00,uVar1);
    gen_helper_vmladduhm(tcg_ctx_00,arg1,arg2,arg3,arg4);
    tcg_temp_free_ptr(tcg_ctx_00,arg2);
    tcg_temp_free_ptr(tcg_ctx_00,arg3);
    tcg_temp_free_ptr(tcg_ctx_00,arg4);
    tcg_temp_free_ptr(tcg_ctx_00,arg1);
  }
  else {
    gen_exception(ctx,0x49);
  }
  return;
}

Assistant:

static void gen_vmladduhm(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_ptr ra, rb, rc, rd;
    if (unlikely(!ctx->altivec_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VPU);
        return;
    }
    ra = gen_avr_ptr(tcg_ctx, rA(ctx->opcode));
    rb = gen_avr_ptr(tcg_ctx, rB(ctx->opcode));
    rc = gen_avr_ptr(tcg_ctx, rC(ctx->opcode));
    rd = gen_avr_ptr(tcg_ctx, rD(ctx->opcode));
    gen_helper_vmladduhm(tcg_ctx, rd, ra, rb, rc);
    tcg_temp_free_ptr(tcg_ctx, ra);
    tcg_temp_free_ptr(tcg_ctx, rb);
    tcg_temp_free_ptr(tcg_ctx, rc);
    tcg_temp_free_ptr(tcg_ctx, rd);
}